

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::create_comp_data(crn_comp *this)

{
  int iVar1;
  uint16 uVar2;
  uint uVar3;
  uint uVar4;
  crn_packed_uint<2U> *this_00;
  uchar *pBuf;
  uint local_6c;
  uint actual_header_size;
  uint i_1;
  crn_header *dst_header;
  uint uStack_58;
  uint i;
  uint level_ofs [16];
  crn_comp *this_local;
  
  utils::zero_object<crnd::crn_header>(&this->m_crn_header);
  crnd::crn_packed_uint<2U>::operator=
            (&(this->m_crn_header).m_width,this->m_pParams->m_width & 0xffff);
  crnd::crn_packed_uint<2U>::operator=
            (&(this->m_crn_header).m_height,this->m_pParams->m_height & 0xffff);
  crnd::crn_packed_uint<1U>::operator=
            (&(this->m_crn_header).m_levels,this->m_pParams->m_levels & 0xff);
  crnd::crn_packed_uint<1U>::operator=
            (&(this->m_crn_header).m_faces,this->m_pParams->m_faces & 0xff);
  crnd::crn_packed_uint<1U>::operator=
            (&(this->m_crn_header).m_format,(uint)this->m_pParams->m_format & 0xff);
  crnd::crn_packed_uint<4U>::operator=
            (&(this->m_crn_header).m_userdata0,this->m_pParams->m_userdata0);
  crnd::crn_packed_uint<4U>::operator=
            (&(this->m_crn_header).m_userdata1,this->m_pParams->m_userdata1);
  vector<unsigned_char>::clear(&this->m_comp_data);
  vector<unsigned_char>::reserve(&this->m_comp_data,0x200000);
  append_vec(&this->m_comp_data,&this->m_crn_header,0x4a);
  uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
  vector<unsigned_char>::resize
            (&this->m_comp_data,uVar3 + (this->m_pParams->m_levels - 1) * 4,false);
  uVar3 = vector<unsigned_char>::size(&this->m_packed_color_endpoints);
  if (uVar3 != 0) {
    uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_color_endpoints.m_num,uVar3 & 0xffff);
    uVar3 = vector<unsigned_char>::size(&this->m_packed_color_endpoints);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_color_endpoints.m_size,uVar3);
    uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_color_endpoints.m_ofs,uVar3);
    append_vec(&this->m_comp_data,&this->m_packed_color_endpoints);
  }
  uVar3 = vector<unsigned_char>::size(&this->m_packed_color_selectors);
  if (uVar3 != 0) {
    uVar3 = vector<unsigned_int>::size(&this->m_color_selectors);
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_color_selectors.m_num,uVar3 & 0xffff);
    uVar3 = vector<unsigned_char>::size(&this->m_packed_color_selectors);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_color_selectors.m_size,uVar3);
    uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_color_selectors.m_ofs,uVar3);
    append_vec(&this->m_comp_data,&this->m_packed_color_selectors);
  }
  uVar3 = vector<unsigned_char>::size(&this->m_packed_alpha_endpoints);
  if (uVar3 != 0) {
    uVar3 = vector<unsigned_int>::size(&this->m_alpha_endpoints);
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_alpha_endpoints.m_num,uVar3 & 0xffff);
    uVar3 = vector<unsigned_char>::size(&this->m_packed_alpha_endpoints);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_alpha_endpoints.m_size,uVar3);
    uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_alpha_endpoints.m_ofs,uVar3);
    append_vec(&this->m_comp_data,&this->m_packed_alpha_endpoints);
  }
  uVar3 = vector<unsigned_char>::size(&this->m_packed_alpha_selectors);
  if (uVar3 != 0) {
    uVar3 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_alpha_selectors.m_num,uVar3 & 0xffff);
    uVar3 = vector<unsigned_char>::size(&this->m_packed_alpha_selectors);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_alpha_selectors.m_size,uVar3);
    uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
    crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_alpha_selectors.m_ofs,uVar3);
    append_vec(&this->m_comp_data,&this->m_packed_alpha_selectors);
  }
  uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
  crnd::crn_packed_uint<3U>::operator=(&(this->m_crn_header).m_tables_ofs,uVar3);
  uVar3 = vector<unsigned_char>::size(&this->m_packed_data_models);
  crnd::crn_packed_uint<2U>::operator=(&(this->m_crn_header).m_tables_size,uVar3);
  append_vec(&this->m_comp_data,&this->m_packed_data_models);
  dst_header._4_4_ = 0;
  while( true ) {
    uVar3 = vector<crnlib::crn_comp::level_details>::size(&this->m_levels);
    if (uVar3 <= dst_header._4_4_) break;
    uVar3 = vector<unsigned_char>::size(&this->m_comp_data);
    (&uStack_58)[dst_header._4_4_] = uVar3;
    append_vec(&this->m_comp_data,this->m_packed_blocks + dst_header._4_4_);
    dst_header._4_4_ = dst_header._4_4_ + 1;
  }
  this_00 = (crn_packed_uint<2U> *)vector<unsigned_char>::operator[](&this->m_comp_data,0);
  memcpy(this_00,&this->m_crn_header,0x4a);
  local_6c = 0;
  while( true ) {
    uVar3 = vector<crnlib::crn_comp::level_details>::size(&this->m_levels);
    if (uVar3 <= local_6c) break;
    crnd::crn_packed_uint<4U>::operator=
              ((crn_packed_uint<4U> *)(this_00 + (ulong)local_6c * 2 + 0x23),(&uStack_58)[local_6c])
    ;
    local_6c = local_6c + 1;
  }
  uVar3 = vector<crnlib::crn_comp::level_details>::size(&this->m_levels);
  iVar1 = (uVar3 - 1) * 4;
  uVar3 = iVar1 + 0x4a;
  crnd::crn_packed_uint<2U>::operator=(this_00,0x4878);
  uVar4 = vector<unsigned_char>::size(&this->m_comp_data);
  crnd::crn_packed_uint<4U>::operator=((crn_packed_uint<4U> *)(this_00 + 3),uVar4);
  pBuf = vector<unsigned_char>::operator[](&this->m_comp_data,uVar3);
  uVar4 = vector<unsigned_char>::size(&this->m_comp_data);
  uVar2 = crc16(pBuf,(ulong)(uVar4 - uVar3),0);
  crnd::crn_packed_uint<2U>::operator=(this_00 + 5,(uint)uVar2);
  crnd::crn_packed_uint<2U>::operator=(this_00 + 1,uVar3);
  uVar2 = crc16(this_00 + 3,(ulong)(iVar1 + 0x44),0);
  crnd::crn_packed_uint<2U>::operator=(this_00 + 2,(uint)uVar2);
  return true;
}

Assistant:

bool crn_comp::create_comp_data()
    {
        utils::zero_object(m_crn_header);

        m_crn_header.m_width = static_cast<uint16>(m_pParams->m_width);
        m_crn_header.m_height = static_cast<uint16>(m_pParams->m_height);
        m_crn_header.m_levels = static_cast<uint8>(m_pParams->m_levels);
        m_crn_header.m_faces = static_cast<uint8>(m_pParams->m_faces);
        m_crn_header.m_format = static_cast<uint8>(m_pParams->m_format);
        m_crn_header.m_userdata0 = m_pParams->m_userdata0;
        m_crn_header.m_userdata1 = m_pParams->m_userdata1;

        m_comp_data.clear();
        m_comp_data.reserve(2 * 1024 * 1024);
        append_vec(m_comp_data, &m_crn_header, sizeof(m_crn_header));
        // tack on the rest of the variable size m_level_ofs array
        m_comp_data.resize(m_comp_data.size() + sizeof(m_crn_header.m_level_ofs[0]) * (m_pParams->m_levels - 1));

        if (m_packed_color_endpoints.size())
        {
            m_crn_header.m_color_endpoints.m_num = static_cast<uint16>(m_color_endpoints.size());
            m_crn_header.m_color_endpoints.m_size = m_packed_color_endpoints.size();
            m_crn_header.m_color_endpoints.m_ofs = m_comp_data.size();
            append_vec(m_comp_data, m_packed_color_endpoints);
        }

        if (m_packed_color_selectors.size())
        {
            m_crn_header.m_color_selectors.m_num = static_cast<uint16>(m_color_selectors.size());
            m_crn_header.m_color_selectors.m_size = m_packed_color_selectors.size();
            m_crn_header.m_color_selectors.m_ofs = m_comp_data.size();
            append_vec(m_comp_data, m_packed_color_selectors);
        }

        if (m_packed_alpha_endpoints.size())
        {
            m_crn_header.m_alpha_endpoints.m_num = static_cast<uint16>(m_alpha_endpoints.size());
            m_crn_header.m_alpha_endpoints.m_size = m_packed_alpha_endpoints.size();
            m_crn_header.m_alpha_endpoints.m_ofs = m_comp_data.size();
            append_vec(m_comp_data, m_packed_alpha_endpoints);
        }

        if (m_packed_alpha_selectors.size())
        {
            m_crn_header.m_alpha_selectors.m_num = static_cast<uint16>(m_alpha_selectors.size());
            m_crn_header.m_alpha_selectors.m_size = m_packed_alpha_selectors.size();
            m_crn_header.m_alpha_selectors.m_ofs = m_comp_data.size();
            append_vec(m_comp_data, m_packed_alpha_selectors);
        }

        m_crn_header.m_tables_ofs = m_comp_data.size();
        m_crn_header.m_tables_size = m_packed_data_models.size();
        append_vec(m_comp_data, m_packed_data_models);

        uint level_ofs[cCRNMaxLevels];
        for (uint i = 0; i < m_levels.size(); i++)
        {
            level_ofs[i] = m_comp_data.size();
            append_vec(m_comp_data, m_packed_blocks[i]);
        }

        crnd::crn_header& dst_header = *(crnd::crn_header*)&m_comp_data[0];
        // don't change the m_comp_data vector - or dst_header will be invalidated!

        memcpy(&dst_header, &m_crn_header, sizeof(dst_header));

        for (uint i = 0; i < m_levels.size(); i++)
        {
            dst_header.m_level_ofs[i] = level_ofs[i];
        }

        const uint actual_header_size = sizeof(crnd::crn_header) + sizeof(dst_header.m_level_ofs[0]) * (m_levels.size() - 1);

        dst_header.m_sig = crnd::crn_header::cCRNSigValue;

        dst_header.m_data_size = m_comp_data.size();
        dst_header.m_data_crc16 = crc16(&m_comp_data[actual_header_size], m_comp_data.size() - actual_header_size);

        dst_header.m_header_size = actual_header_size;
        dst_header.m_header_crc16 = crc16(&dst_header.m_data_size, actual_header_size - (uint)((uint8*)&dst_header.m_data_size - (uint8*)&dst_header));

        return true;
    }